

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

void __thiscall
Js::Type::Type(Type *this,ScriptContext *scriptContext,TypeId typeId,RecyclableObject *prototype,
              JavascriptMethod entryPoint)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  
  this->typeId = typeId;
  this->flags = TypeFlagMask_None;
  pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  Memory::Recycler::WBSetBit((char *)&this->javascriptLibrary);
  (this->javascriptLibrary).ptr = pJVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->javascriptLibrary);
  Memory::Recycler::WBSetBit((char *)&this->prototype);
  (this->prototype).ptr = prototype;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->prototype);
  (this->propertyCache).ptr = (TypePropertyCache *)0x0;
  if (typeId < TypeIds_Limit) {
    scriptContext->typeCount[typeId] = scriptContext->typeCount[typeId] + 1;
  }
  if (entryPoint == (JavascriptMethod)0x0) {
    entryPoint = RecyclableObject::DefaultEntryPoint;
  }
  this->entryPoint = (Type)entryPoint;
  if (prototype != (RecyclableObject *)0x0) {
    BVar4 = CrossSite::NeedMarshalVar(prototype,scriptContext);
    if (BVar4 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/Type.cpp"
                                  ,0x22,"(! CrossSite::NeedMarshalVar(prototype,scriptContext))",
                                  "! CrossSite::NeedMarshalVar(prototype,scriptContext)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    RecyclableObject::SetIsPrototype(prototype);
    return;
  }
  return;
}

Assistant:

Type::Type(ScriptContext* scriptContext, TypeId typeId, RecyclableObject* prototype, JavascriptMethod entryPoint) :
        javascriptLibrary(scriptContext->GetLibrary()),
        typeId(typeId),
        prototype(prototype),
        propertyCache(nullptr),
        flags(TypeFlagMask_None)
    {
#ifdef PROFILE_TYPES
        if (typeId < sizeof(scriptContext->typeCount)/sizeof(int))
        {
            scriptContext->typeCount[typeId]++;
        }
#endif
        this->entryPoint = entryPoint != nullptr ? entryPoint : RecyclableObject::DefaultEntryPoint;
        if (prototype)
        {
            Assert(! CrossSite::NeedMarshalVar(prototype,scriptContext));
            prototype->SetIsPrototype();
        }
    }